

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall ddd::DaTrie<false,_false,_false>::push_block_(DaTrie<false,_false,_false> *this)

{
  pointer *ppBVar1;
  ulong uVar2;
  iterator __position;
  iterator __position_00;
  pointer pBVar3;
  ulong uVar4;
  int iVar5;
  uint32_t block_pos;
  ulong uVar6;
  Block local_34;
  Bc local_30;
  
  uVar6 = (ulong)((long)(this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 2;
  iVar5 = 0x100;
  do {
    local_30 = (Bc)0x0;
    __position._M_current =
         (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::_M_realloc_insert<ddd::Bc>
                (&this->bc_,__position,&local_30);
    }
    else {
      *__position._M_current = (Bc)0x0;
      ppBVar1 = &(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppBVar1 = *ppBVar1 + 1;
    }
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  local_34.num_emps = 0x100;
  __position_00._M_current =
       (this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ddd::Block,_std::allocator<ddd::Block>_>::_M_realloc_insert<ddd::Block>
              (&this->blocks_,__position_00,&local_34);
  }
  else {
    (__position_00._M_current)->num_emps = 0x100;
    (this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
    super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  block_pos = (uint32_t)uVar6;
  if (block_pos * 0x100 != -0x100) {
    uVar4 = (uVar6 << 0x28) + 0x7fffffff00000000;
    uVar6 = (ulong)(block_pos << 8);
    do {
      uVar2 = uVar6 + 1;
      *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                super__Vector_impl_data._M_start + uVar6) = (uint)uVar2 & 0x7fffffff;
      pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar3[uVar6] = (Bc)((ulong)pBVar3[uVar6] & 0x80000000ffffffff | uVar4 & 0x7fffffff00000000);
      uVar4 = uVar4 + 0x100000000;
      uVar6 = uVar2;
    } while (uVar2 < block_pos * 0x100 + 0x100);
  }
  push_block_(this,block_pos,&this->blocks_);
  this->bc_emps_ = this->bc_emps_ + 0x100;
  return;
}

Assistant:

void push_block_() {
    auto block_pos = num_blocks();

    for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
      bc_.push_back(Bc{});
    }
    if (WithNLM) {
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        node_links_.push_back(NodeLink{});
      }
    }
    blocks_.push_back(BlockType{});

    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;

    for (auto i = begin; i < end; ++i) {
      set_next_(i, i + 1);
      set_prev_(i, i - 1);
    }

    push_block_(block_pos, blocks_);
    bc_emps_ += BLOCK_SIZE;
  }